

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

size_t __thiscall CLI::App::remaining_size(App *this,bool recurse)

{
  pointer puVar1;
  size_t sVar2;
  size_t sVar3;
  undefined7 in_register_00000031;
  App_p *sub;
  pointer puVar4;
  
  sVar2 = ::std::
          __count_if<__gnu_cxx::__normal_iterator<std::pair<CLI::detail::Classifer,std::__cxx11::string>const*,std::vector<std::pair<CLI::detail::Classifer,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifer,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::remaining_size(bool)const::_lambda(std::pair<CLI::detail::Classifer,std::__cxx11::string>const&)_1_>>
                    ((this->missing_).
                     super__Vector_base<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->missing_).
                     super__Vector_base<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if ((int)CONCAT71(in_register_00000031,recurse) != 0) {
    puVar1 = (this->subcommands_).
             super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar4 = (this->subcommands_).
                  super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1)
    {
      sVar3 = remaining_size((puVar4->_M_t).
                             super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
                             super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                             super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl,true);
      sVar2 = sVar2 + sVar3;
    }
  }
  return sVar2;
}

Assistant:

size_t remaining_size(bool recurse = false) const {
        size_t count = std::count_if(
            std::begin(missing_), std::end(missing_), [](const std::pair<detail::Classifer, std::string> &val) {
                return val.first != detail::Classifer::POSITIONAL_MARK;
            });
        if(recurse) {
            for(const App_p &sub : subcommands_) {
                count += sub->remaining_size(recurse);
            }
        }
        return count;
    }